

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbistbl.cpp
# Opt level: O2

UnicodeFunctor * __thiscall icu_63::RBBISymbolTable::lookupMatcher(RBBISymbolTable *this,UChar32 ch)

{
  UnicodeSet *pUVar1;
  
  if (ch == 0xffff) {
    pUVar1 = this->fCachedSetLookup;
    this->fCachedSetLookup = (UnicodeSet *)0x0;
    return (UnicodeFunctor *)pUVar1;
  }
  return (UnicodeFunctor *)0x0;
}

Assistant:

const UnicodeFunctor *RBBISymbolTable::lookupMatcher(UChar32 ch) const
{
    UnicodeSet *retVal = NULL;
    RBBISymbolTable *This = (RBBISymbolTable *)this;   // cast off const
    if (ch == 0xffff) {
        retVal = fCachedSetLookup;
        This->fCachedSetLookup = 0;
    }
    return retVal;
}